

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1b0fcc::BracedRangeExpr::printLeft(BracedRangeExpr *this,OutputStream *S)

{
  size_t sVar1;
  Node *pNVar2;
  char *pcVar3;
  
  OutputStream::grow(S,1);
  sVar1 = S->CurrentPosition;
  S->CurrentPosition = sVar1 + 1;
  S->Buffer[sVar1] = '[';
  pNVar2 = this->First;
  (*pNVar2->_vptr_Node[4])(pNVar2,S);
  if (pNVar2->RHSComponentCache != No) {
    (*pNVar2->_vptr_Node[5])(pNVar2,S);
  }
  OutputStream::grow(S,5);
  builtin_strncpy(S->Buffer + S->CurrentPosition," ... ",5);
  S->CurrentPosition = S->CurrentPosition + 5;
  pNVar2 = this->Last;
  (*pNVar2->_vptr_Node[4])(pNVar2,S);
  if (pNVar2->RHSComponentCache != No) {
    (*pNVar2->_vptr_Node[5])(pNVar2,S);
  }
  OutputStream::grow(S,1);
  sVar1 = S->CurrentPosition;
  S->CurrentPosition = sVar1 + 1;
  S->Buffer[sVar1] = ']';
  if ((this->Init->K & ~KDotSuffix) != KBracedExpr) {
    OutputStream::grow(S,3);
    pcVar3 = S->Buffer;
    sVar1 = S->CurrentPosition;
    pcVar3[sVar1 + 2] = ' ';
    pcVar3 = pcVar3 + sVar1;
    pcVar3[0] = ' ';
    pcVar3[1] = '=';
    S->CurrentPosition = S->CurrentPosition + 3;
  }
  pNVar2 = this->Init;
  (*pNVar2->_vptr_Node[4])(pNVar2,S);
  if (pNVar2->RHSComponentCache == No) {
    return;
  }
  (*pNVar2->_vptr_Node[5])(pNVar2,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += '[';
    First->print(S);
    S += " ... ";
    Last->print(S);
    S += ']';
    if (Init->getKind() != KBracedExpr && Init->getKind() != KBracedRangeExpr)
      S += " = ";
    Init->print(S);
  }